

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface.cc
# Opt level: O0

bool __thiscall RealDiskInterface::WriteFile(RealDiskInterface *this,string *path,string *contents)

{
  int iVar1;
  char *pcVar2;
  FILE *__s;
  undefined8 uVar3;
  int *piVar4;
  void *__ptr;
  size_t sVar5;
  ulong uVar6;
  FILE *fp;
  string *contents_local;
  string *path_local;
  RealDiskInterface *this_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  __s = fopen(pcVar2,"w");
  if (__s == (FILE *)0x0) {
    uVar3 = std::__cxx11::string::c_str();
    piVar4 = __errno_location();
    pcVar2 = strerror(*piVar4);
    Error("WriteFile(%s): Unable to create file. %s",uVar3,pcVar2);
    this_local._7_1_ = false;
  }
  else {
    __ptr = (void *)std::__cxx11::string::data();
    sVar5 = std::__cxx11::string::length();
    sVar5 = fwrite(__ptr,1,sVar5,__s);
    uVar6 = std::__cxx11::string::length();
    if (sVar5 < uVar6) {
      uVar3 = std::__cxx11::string::c_str();
      piVar4 = __errno_location();
      pcVar2 = strerror(*piVar4);
      Error("WriteFile(%s): Unable to write to the file. %s",uVar3,pcVar2);
      fclose(__s);
      this_local._7_1_ = false;
    }
    else {
      iVar1 = fclose(__s);
      if (iVar1 == -1) {
        uVar3 = std::__cxx11::string::c_str();
        piVar4 = __errno_location();
        pcVar2 = strerror(*piVar4);
        Error("WriteFile(%s): Unable to close the file. %s",uVar3,pcVar2);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool RealDiskInterface::WriteFile(const string& path, const string& contents) {
  FILE* fp = fopen(path.c_str(), "w");
  if (fp == NULL) {
    Error("WriteFile(%s): Unable to create file. %s",
          path.c_str(), strerror(errno));
    return false;
  }

  if (fwrite(contents.data(), 1, contents.length(), fp) < contents.length())  {
    Error("WriteFile(%s): Unable to write to the file. %s",
          path.c_str(), strerror(errno));
    fclose(fp);
    return false;
  }

  if (fclose(fp) == EOF) {
    Error("WriteFile(%s): Unable to close the file. %s",
          path.c_str(), strerror(errno));
    return false;
  }

  return true;
}